

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgesture.cpp
# Opt level: O3

void QGesture::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  char *pcVar1;
  uint *puVar2;
  long lVar3;
  undefined8 uVar4;
  __atomic_base<int> _Var5;
  uint uVar6;
  InterfaceType *pIVar7;
  
  if (_c == ReadProperty) {
    if ((uint)_id < 5) {
      puVar2 = (uint *)*_a;
      switch(_id) {
      case 0:
        uVar6 = *(uint *)(*(long *)(_o + 8) + 0x7c);
        break;
      case 1:
        uVar6 = *(uint *)(*(long *)(_o + 8) + 0x78);
        break;
      case 2:
        uVar6 = *(uint *)(*(long *)(_o + 8) + 0xa0) >> 1 & 3;
        break;
      case 3:
        uVar4 = *(undefined8 *)(*(long *)(_o + 8) + 0x88);
        *(undefined8 *)puVar2 = *(undefined8 *)(*(long *)(_o + 8) + 0x80);
        *(undefined8 *)(puVar2 + 2) = uVar4;
        return;
      case 4:
        *(byte *)puVar2 = *(byte *)(*(long *)(_o + 8) + 0xa0) & 1;
        return;
      }
      *puVar2 = uVar6;
      return;
    }
    return;
  }
  if (_c == WriteProperty) {
    pcVar1 = (char *)*_a;
    if (_id == 3) {
      lVar3 = *(long *)(_o + 8);
      uVar4 = *(undefined8 *)(pcVar1 + 8);
      *(undefined8 *)(lVar3 + 0x80) = *(undefined8 *)pcVar1;
      *(undefined8 *)(lVar3 + 0x88) = uVar4;
      *(byte *)(lVar3 + 0xa0) = *(byte *)(lVar3 + 0xa0) | 1;
      return;
    }
    if (_id != 2) {
      return;
    }
    *(byte *)(*(long *)(_o + 8) + 0xa0) =
         *(byte *)(*(long *)(_o + 8) + 0xa0) & 0xf9 | *pcVar1 * '\x02' & 6U;
    return;
  }
  if (_c != RegisterPropertyMetaType) {
    if (_id != 3 || _c != ResetProperty) {
      return;
    }
    *(byte *)(*(long *)(_o + 8) + 0xa0) = *(byte *)(*(long *)(_o + 8) + 0xa0) & 0xfe;
    return;
  }
  if (_id == 0) {
    _Var5._M_i = (__int_type)
                 QtPrivate::QMetaTypeInterfaceWrapper<Qt::GestureState>::metaType.typeId._q_value.
                 super___atomic_base<int>._M_i;
    if ((__atomic_base<int>)
        QtPrivate::QMetaTypeInterfaceWrapper<Qt::GestureState>::metaType.typeId._q_value.
        super___atomic_base<int>._M_i != (__atomic_base<int>)0x0) goto LAB_002ce70d;
    pIVar7 = &QtPrivate::QMetaTypeInterfaceWrapper<Qt::GestureState>::metaType;
  }
  else if (_id == 1) {
    _Var5._M_i = (__int_type)
                 QtPrivate::QMetaTypeInterfaceWrapper<Qt::GestureType>::metaType.typeId._q_value.
                 super___atomic_base<int>._M_i;
    if ((__atomic_base<int>)
        QtPrivate::QMetaTypeInterfaceWrapper<Qt::GestureType>::metaType.typeId._q_value.
        super___atomic_base<int>._M_i != (__atomic_base<int>)0x0) goto LAB_002ce70d;
    pIVar7 = &QtPrivate::QMetaTypeInterfaceWrapper<Qt::GestureType>::metaType;
  }
  else {
    if (_id != 2) {
      *(undefined4 *)*_a = 0xffffffff;
      return;
    }
    _Var5._M_i = (__int_type)
                 QtPrivate::QMetaTypeInterfaceWrapper<QGesture::GestureCancelPolicy>::metaType.
                 typeId._q_value.super___atomic_base<int>._M_i;
    if ((__atomic_base<int>)
        QtPrivate::QMetaTypeInterfaceWrapper<QGesture::GestureCancelPolicy>::metaType.typeId.
        _q_value.super___atomic_base<int>._M_i != (__atomic_base<int>)0x0) goto LAB_002ce70d;
    pIVar7 = &QtPrivate::QMetaTypeInterfaceWrapper<QGesture::GestureCancelPolicy>::metaType;
  }
  _Var5._M_i = QMetaType::registerHelper(pIVar7);
LAB_002ce70d:
  ((__atomic_base<int> *)*_a)->_M_i = _Var5._M_i;
  return;
}

Assistant:

void QGesture::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGesture *>(_o);
    if (_c == QMetaObject::RegisterPropertyMetaType) {
        switch (_id) {
        default: *reinterpret_cast<int*>(_a[0]) = -1; break;
        case 2:
            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< QGesture::GestureCancelPolicy >(); break;
        case 0:
            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< Qt::GestureState >(); break;
        case 1:
            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< Qt::GestureType >(); break;
        }
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<Qt::GestureState*>(_v) = _t->state(); break;
        case 1: *reinterpret_cast<Qt::GestureType*>(_v) = _t->gestureType(); break;
        case 2: *reinterpret_cast<QGesture::GestureCancelPolicy*>(_v) = _t->gestureCancelPolicy(); break;
        case 3: *reinterpret_cast<QPointF*>(_v) = _t->hotSpot(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->hasHotSpot(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 2: _t->setGestureCancelPolicy(*reinterpret_cast<QGesture::GestureCancelPolicy*>(_v)); break;
        case 3: _t->setHotSpot(*reinterpret_cast<QPointF*>(_v)); break;
        default: break;
        }
    }
if (_c == QMetaObject::ResetProperty) {
        switch (_id) {
        case 3: _t->unsetHotSpot(); break;
        default: break;
        }
    }
}